

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

double evaluate_CAI_N(string *rna,vector<int,_std::allocator<int>_> *protein,int type)

{
  int iVar1;
  allocator_type *__a;
  int in_EDX;
  string *in_RDI;
  double dVar2;
  double CAI;
  vector<int,_std::allocator<int>_> seq;
  int l;
  string *in_stack_ffffffffffffff78;
  undefined1 *__n;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  string local_68 [48];
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  
  iVar1 = std::__cxx11::string::size();
  __a = (allocator_type *)(long)iVar1;
  __n = &stack0xffffffffffffffcf;
  std::allocator<int>::allocator((allocator<int> *)0x1332ee);
  std::vector<int,_std::allocator<int>_>::vector(in_stack_ffffffffffffff90,(size_type)__n,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x13330e);
  std::__cxx11::string::string(local_68,in_RDI);
  transform2num((vector<int,_std::allocator<int>_> *)__a,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_68);
  if (in_EDX == 1) {
    dVar2 = getCAI_s(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    dVar2 = stand_getCAI_s(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  return dVar2;
}

Assistant:

double evaluate_CAI_N(string & rna,vector<int> & protein,int type) {
    int l = int(rna.size());
    vector<int> seq(l);
    transform2num(seq,rna);
    double CAI;
    if (type == 1) CAI = getCAI_s(seq, protein);
    else CAI = stand_getCAI_s(seq, protein);
    return CAI;
}